

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

bool __thiscall ON_Layer::Read(ON_Layer *this,ON_BinaryArchive *file)

{
  ON_Color *color;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  SectionFillRule rule;
  ON_ComponentStatus OVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  wchar_t *component_name;
  uchar itemid;
  int minor_version;
  bool bLocked;
  bool bVisible;
  bool noClippingPlanes;
  undefined6 uStack_116;
  int render_material_index;
  int layer_index;
  int mode;
  ON_wString layer_name;
  int line_pattern_index;
  int major_version;
  int obsolete_value1;
  double x;
  uchar auStack_e0 [8];
  short s;
  unsigned_short uStack_34;
  unsigned_short uStack_32;
  uchar auStack_30 [8];
  
  obsolete_value1 = 0;
  major_version = 0;
  minor_version = 0;
  mode = 0;
  operator=(this,&Unset);
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&major_version,&minor_version);
  if ((!bVar1) || (major_version != 1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
               ,0x3b0,"","ON_Layer::Read() encountered a layer written by future code.");
    return false;
  }
  bVar1 = ON_BinaryArchive::ReadInt(file,&mode);
  if (bVar1) {
    if (mode == 2) {
      ON_ModelComponent::SetLockedModelComponentState(&this->super_ON_ModelComponent,true);
    }
    else if (mode == 1) {
      ON_ModelComponent::SetHiddenModelComponentState(&this->super_ON_ModelComponent,true);
    }
    layer_index = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
    bVar1 = ON_BinaryArchive::ReadInt(file,&layer_index);
    if (!bVar1) goto LAB_004da6ae;
    ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,layer_index);
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_iges_level);
    render_material_index = -0x7fffffff;
    if (!bVar1) goto LAB_004da6b6;
    bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Material,&render_material_index);
    if (render_material_index == -0x7fffffff || !bVar1) {
      if (!bVar1) goto LAB_004da6b6;
    }
    else {
      SetRenderMaterialIndex(this,render_material_index);
    }
    bVar1 = ON_BinaryArchive::ReadInt(file,&obsolete_value1);
    if (!bVar1) goto LAB_004da6b6;
    color = &this->m_color;
    bVar1 = ON_BinaryArchive::ReadColor(file,color);
    if (!bVar1) goto LAB_004da6b6;
    iVar5 = ON_Color::Alpha(color);
    if (iVar5 == 0xff) {
      uVar6 = ON_Color::operator_cast_to_unsigned_int(color);
      uVar7 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
      if ((uVar6 != uVar7) && (iVar5 = ON_BinaryArchive::Archive3dmVersion(file), iVar5 < 0x46)) {
        ON_Color::SetAlpha(color,0);
      }
    }
    ON_BinaryArchive::ReadShort(file,&s);
    ON_BinaryArchive::ReadShort(file,&s);
    ON_BinaryArchive::ReadDouble(file,&x);
    ON_BinaryArchive::ReadDouble(file,&x);
    ON_wString::ON_wString(&layer_name);
    bVar1 = ON_BinaryArchive::ReadString(file,&layer_name);
    if (!bVar1) goto LAB_004da6c0;
    component_name = ON_wString::operator_cast_to_wchar_t_(&layer_name);
    ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
    if (minor_version < 1) {
      bVar1 = true;
      goto LAB_004da6c2;
    }
    bVisible = true;
    bVar1 = ON_BinaryArchive::ReadBool(file,&bVisible);
    if (bVisible == false && bVar1) {
      ON_ModelComponent::SetHiddenModelComponentState(&this->super_ON_ModelComponent,true);
    }
    OVar4 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
    x = (double)CONCAT62(x._2_6_,OVar4);
    bVar2 = ON_ComponentStatus::IsHidden((ON_ComponentStatus *)&x);
    bVisible = !bVar2;
    if (minor_version < 2 || !bVar1) goto LAB_004da6c2;
    line_pattern_index = -0x7fffffff;
    bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,LinePattern,&line_pattern_index);
    if (line_pattern_index != -0x7fffffff && bVar1) {
      SetLinetypeIndex(this,line_pattern_index);
    }
    if (minor_version < 3 || !bVar1) goto LAB_004da6c2;
    bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_plot_color);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_plot_weight_mm);
      if (minor_version < 4 || !bVar1) goto LAB_004da6c2;
      bLocked = false;
      bVar1 = ON_BinaryArchive::ReadBool(file,&bLocked);
      if ((bVar1) && (bLocked == true)) {
        ON_ModelComponent::SetLockedModelComponentState(&this->super_ON_ModelComponent,true);
      }
      OVar4 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
      x = (double)CONCAT62(x._2_6_,OVar4);
      bLocked = ON_ComponentStatus::IsLocked((ON_ComponentStatus *)&x);
      if (minor_version < 5 || !bVar1) goto LAB_004da6c2;
      _s = 0;
      uStack_34 = 0;
      uStack_32 = 0;
      auStack_30[0] = '\0';
      auStack_30[1] = '\0';
      auStack_30[2] = '\0';
      auStack_30[3] = '\0';
      auStack_30[4] = '\0';
      auStack_30[5] = '\0';
      auStack_30[6] = '\0';
      auStack_30[7] = '\0';
      bVar1 = ON_BinaryArchive::ReadUuid(file,(ON_UUID *)&s);
      if (!bVar1) goto LAB_004da6c0;
      ON_ModelComponent::SetId(&this->super_ON_ModelComponent,(ON_UUID *)&s);
      bVar1 = true;
      if ((5 < minor_version) &&
         (uVar6 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), 0xbf37716 < uVar6)) {
        x = (double)0;
        auStack_e0[0] = '\0';
        auStack_e0[1] = '\0';
        auStack_e0[2] = '\0';
        auStack_e0[3] = '\0';
        auStack_e0[4] = '\0';
        auStack_e0[5] = '\0';
        auStack_e0[6] = '\0';
        auStack_e0[7] = '\0';
        bVar1 = ON_BinaryArchive::ReadUuid(file,(ON_UUID *)&x);
        if (bVar1) {
          ON_ModelComponent::SetParentId(&this->super_ON_ModelComponent,(ON_UUID *)&x);
          bVar1 = ON_UuidIsNotNil((ON_UUID *)&x);
          if (bVar1) {
            OVar4 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
            _noClippingPlanes = (double)CONCAT62(uStack_116,OVar4);
            bVar1 = ON_ComponentStatus::IsHidden((ON_ComponentStatus *)&noClippingPlanes);
            if (bVar1) {
              SetPersistentVisibility(this,false);
            }
            OVar4 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
            _noClippingPlanes = (double)CONCAT62(uStack_116,OVar4);
            bVar1 = ON_ComponentStatus::IsLocked((ON_ComponentStatus *)&noClippingPlanes);
            if (bVar1) {
              SetPersistentLocking(this,true);
            }
          }
          bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bExpanded);
        }
        else {
          bVar1 = false;
        }
      }
      if (((bVar1 == false) || (minor_version < 7)) ||
         (bVar1 = ON_RenderingAttributes::Read(&this->m_rendering_attributes,file),
         minor_version < 8 || !bVar1)) goto LAB_004da6c2;
      bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_display_material_id);
      if (minor_version == 9 && bVar1) {
        x = (double)((ulong)x & 0xffffffffffffff00);
        bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&x);
        if (bVar1) {
          x = (double)((ulong)x & 0xffffffffffffff00);
          bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&x);
        }
        else {
          bVar1 = false;
        }
      }
      if ((bVar1 == false) || (minor_version < 10)) goto LAB_004da6c2;
      itemid = 0xff;
      bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
      if (bVar1 && itemid != '\0') {
        if (itemid == '\x1c') {
          _noClippingPlanes = (double)((ulong)_noClippingPlanes & 0xffffffffffffff00);
          ON_UuidList::ON_UuidList((ON_UuidList *)&x);
          bVar3 = ON_BinaryArchive::ReadBool(file,&noClippingPlanes);
          bVar1 = false;
          bVar2 = false;
          if (bVar3) {
            bVar3 = ON_UuidList::Read((ON_UuidList *)&x,file);
            bVar1 = false;
            bVar2 = false;
            if (bVar3) {
              bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
              bVar2 = itemid != '\0' && bVar1;
            }
          }
          ON_UuidList::~ON_UuidList((ON_UuidList *)&x);
          if (!bVar2) goto LAB_004daedf;
        }
        if (10 < minor_version) {
          if (itemid == '\x1d') {
            _noClippingPlanes = (double)((ulong)_noClippingPlanes & 0xffffffff00000000);
            bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex
                              (file,HatchPattern,(int *)&noClippingPlanes);
            if (bVar1) {
              ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&x);
              CustomSectionStyle(this,(ON_SectionStyle *)&x);
              ON_SectionStyle::SetHatchIndex((ON_SectionStyle *)&x,_noClippingPlanes);
              SetCustomSectionStyle(this,(ON_SectionStyle *)&x);
              bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
              bVar2 = itemid == '\0';
              ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&x);
              if (!bVar1 || bVar2) goto LAB_004daedf;
              bVar1 = true;
              goto LAB_004dabbd;
            }
LAB_004daedd:
            bVar1 = false;
          }
          else {
LAB_004dabbd:
            if (itemid == '\x1e') {
              _noClippingPlanes = 1.0;
              bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&noClippingPlanes);
              if (!bVar1) goto LAB_004daedd;
              ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&x);
              CustomSectionStyle(this,(ON_SectionStyle *)&x);
              ON_SectionStyle::SetHatchScale((ON_SectionStyle *)&x,_noClippingPlanes);
              SetCustomSectionStyle(this,(ON_SectionStyle *)&x);
              bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
              bVar2 = itemid == '\0';
              ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&x);
              if (!bVar1 || bVar2) goto LAB_004daedf;
              bVar1 = true;
            }
            if (itemid == '\x1f') {
              _noClippingPlanes = 0.0;
              bVar1 = ON_BinaryArchive::ReadDouble(file,(double *)&noClippingPlanes);
              if (!bVar1) goto LAB_004daedd;
              ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&x);
              CustomSectionStyle(this,(ON_SectionStyle *)&x);
              ON_SectionStyle::SetHatchRotation((ON_SectionStyle *)&x,_noClippingPlanes);
              SetCustomSectionStyle(this,(ON_SectionStyle *)&x);
              bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
              bVar2 = itemid == '\0';
              ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&x);
              if (!bVar1 || bVar2) goto LAB_004daedf;
              bVar1 = true;
            }
            if (0xb < minor_version) {
              if (itemid == ' ') {
                _noClippingPlanes = (double)((ulong)_noClippingPlanes & 0xffffffffffffff00);
                bVar1 = ON_BinaryArchive::ReadChar(file,&noClippingPlanes);
                if (!bVar1) goto LAB_004daedd;
                ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&x);
                CustomSectionStyle(this,(ON_SectionStyle *)&x);
                rule = ON::SectionFillRuleFromUnsigned((uint)noClippingPlanes);
                ON_SectionStyle::SetSectionFillRule((ON_SectionStyle *)&x,rule);
                SetCustomSectionStyle(this,(ON_SectionStyle *)&x);
                bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
                bVar2 = itemid == '\0';
                ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&x);
                if (!bVar1 || bVar2) goto LAB_004daedf;
                bVar1 = true;
              }
              if (0xc < minor_version) {
                if (itemid == '!') {
                  ON_Linetype::ON_Linetype((ON_Linetype *)&x);
                  bVar3 = ON_Linetype::Read((ON_Linetype *)&x,file);
                  bVar1 = false;
                  bVar2 = false;
                  if (bVar3) {
                    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
                    bVar2 = itemid != '\0' && bVar1;
                  }
                  ON_Linetype::~ON_Linetype((ON_Linetype *)&x);
                  if (!bVar2) goto LAB_004daedf;
                }
                if (0xd < minor_version) {
                  if (itemid == '\"') {
                    x = (double)CONCAT71(x._1_7_,1);
                    bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)&x);
                    if (!bVar1) goto LAB_004daedd;
                    SetPerViewportIsVisibleInNewDetails(this,x._0_1_);
                    bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
                    if (!bVar1 || itemid == '\0') goto LAB_004daedf;
                    bVar1 = true;
                  }
                  if (0xe < minor_version) {
                    if (itemid == '#') {
                      ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&x);
                      bVar3 = ON_SectionStyle::Read((ON_SectionStyle *)&x,file);
                      bVar1 = false;
                      bVar2 = false;
                      if (bVar3) {
                        SetCustomSectionStyle(this,(ON_SectionStyle *)&x);
                        bVar1 = ON_BinaryArchive::ReadChar(file,&itemid);
                        bVar2 = itemid != '\0' && bVar1;
                      }
                      ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&x);
                      if (!bVar2) goto LAB_004daedf;
                    }
                    if (itemid == '$') {
                      x = (double)CONCAT71(x._1_7_,1);
                      ON_BinaryArchive::ReadBool(file,(bool *)&x);
                      if ((bVar1 == false) ||
                         (bVar1 = ON_BinaryArchive::ReadChar(file,&itemid), !bVar1 || itemid == '\0'
                         )) goto LAB_004daedf;
                    }
                    if (0x24 < itemid) {
                      itemid = '\0';
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_004daedf:
      if ((bVar1 != false) && (itemid != '\0')) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
                   ,0x39c,"","Bug in ON_Layer::Read or Write");
      }
      goto LAB_004da6c2;
    }
  }
  else {
    layer_index = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
LAB_004da6ae:
    render_material_index = -0x7fffffff;
LAB_004da6b6:
    ON_wString::ON_wString(&layer_name);
  }
LAB_004da6c0:
  bVar1 = false;
LAB_004da6c2:
  bVar2 = ON_ModelComponent::IdIsNil(&this->super_ON_ModelComponent);
  if (bVar2) {
    ON_ModelComponent::SetId(&this->super_ON_ModelComponent);
  }
  ON_wString::~ON_wString(&layer_name);
  return bVar1;
}

Assistant:

bool ON_Layer::Read(
       ON_BinaryArchive& file // restore definition from binary archive
     )
{
  int obsolete_value1 = 0; // see ON_Layer::Write
  int major_version=0;
  int minor_version=0;
  int mode = ON::normal_layer;
  *this = ON_Layer::Unset;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 )
  {
    // common to all 1.x formats
    if ( rc ) rc = file.ReadInt( &mode );
    if ( rc ) 
    {
      switch(mode)
      {
      case 0: // OBSOLETE ON::normal_layer
        break;
      case 1: // OBSOLETE ON::hidden_layer
        SetHiddenModelComponentState(true);
        break;
      case 2: // OBSOLETE ON::locked_layer
        SetLockedModelComponentState( true );
        break;
      default:
        break;
      }
    }
    int layer_index = Index();
    if (rc)
    {
      // this is the archive layer index - it will probably change when the
      // layer is added to the model. Since the layer has not been added to
      // the model, there is not way to automatically update it at this time.
      rc = file.ReadInt(&layer_index);
    }
    if (rc)
      SetIndex(layer_index);

    if ( rc ) rc = file.ReadInt( &m_iges_level );

    // render material index
    int render_material_index = ON_UNSET_INT_INDEX;
    if (rc) 
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::RenderMaterial,&render_material_index);
    if (rc && ON_UNSET_INT_INDEX != render_material_index )
      SetRenderMaterialIndex(render_material_index);

    if ( rc ) rc = file.ReadInt( &obsolete_value1 );
    if ( rc ) rc = file.ReadColor( m_color );

    // 25 Aug 2021 S. Baer (RH-65410)
    // Pre-V7 files ignored alpha on layer colors and in some cases
    // alpha was being set to completely transparent. In this case,
    // make the color opaque. Even V7 files with completely transparent
    // color is strange, but it can be intentionally set for some reason
    if (rc && m_color.Alpha() == 255 && m_color != ON_Color::UnsetColor && file.Archive3dmVersion() < 70)
    {
      m_color.SetAlpha(0);
    }

    {
      // OBSOLETE line style was never used - read and discard the next 20 bytes
      short s;
      double x;
      if (rc) file.ReadShort(&s);
      if (rc) file.ReadShort(&s);
      if (rc) file.ReadDouble(&x);
      if (rc) file.ReadDouble(&x);
    }

    ON_wString layer_name;
    if ( rc ) rc = file.ReadString( layer_name );
    if (rc)
      SetName(layer_name);

    if ( rc && minor_version >= 1 )
    {
      bool bVisible = true;
      rc = file.ReadBool(&bVisible);
      if ( rc && false == bVisible)
        SetHiddenModelComponentState(true);
      bVisible = (false == ModelComponentStatus().IsHidden());

      if ( rc && minor_version >= 2 )
      {
        // line pattern index
        int line_pattern_index = ON_UNSET_INT_INDEX;
        rc = file.Read3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, &line_pattern_index );
        if (rc && ON_UNSET_INT_INDEX != line_pattern_index)
          SetLinetypeIndex(line_pattern_index);

        if (rc && minor_version >= 3 )
        {
          // 23 March 2005 Dale Lear
          rc = file.ReadColor( m_plot_color);
          if (rc) rc = file.ReadDouble( &m_plot_weight_mm);

          if (rc && minor_version >= 4 )
          {
            bool bLocked = false;
            rc = file.ReadBool(&bLocked);
            if (rc && bLocked )
              SetLockedModelComponentState(bLocked);
            bLocked = ModelComponentStatus().IsLocked();

            if (rc && minor_version >= 5 )
            {
              ON_UUID layer_id = ON_nil_uuid;
              rc = file.ReadUuid(layer_id);
              if (rc)
                SetId(layer_id);
              if ( rc
                   && minor_version >= 6
                   && file.ArchiveOpenNURBSVersion() > 200505110
                 )
              {
                // Some files saved with opennurbs version 200505110 
                // do not contain correctly written m_parent_layer_id
                // and m_bExpanded values.
                // It is ok to default these values.
                ON_UUID parent_layer_id = ON_nil_uuid;
                rc = file.ReadUuid(parent_layer_id);
                if (rc)
                {
                  SetParentId(parent_layer_id);
                  if ( ON_UuidIsNotNil(parent_layer_id) )
                  {
                    //SetParentId(parent_layer_id);
                    if ( ModelComponentStatus().IsHidden() )
                      SetPersistentVisibility(false);
                    if ( ModelComponentStatus().IsLocked())
                      SetPersistentLocking(true);
                  }
                  rc = file.ReadBool(&m_bExpanded);
                }
              }

              if ( rc && minor_version >= 7 )
              {
                // 1.7 field - added 6 June 2006
                rc = m_rendering_attributes.Read(file);

                if ( rc && minor_version >= 8 )
                {
                  // 1.8 field - added 19 Sep 2006
                  rc = file.ReadUuid(m_display_material_id);

                  if (rc && minor_version == 9)
                  {
                    // 1.9 field - added 11 Aug 2021 and removed on 12 Aug 2021
                    // Note above that we are looking specifically at minor_version of 9
                    // read two chars and throw them away.
                    // minor_version >= 10 should skip this entirely
                    unsigned char style = 0;
                    rc = file.ReadChar(&style);
                    if (rc)
                    {
                      style = 0;
                      rc = file.ReadChar(&style);
                    }
                  }

                  if (rc && minor_version >= 10)
                  {
                    unsigned char itemid = 0xFF;
                    while (rc)
                    {
                      rc = file.ReadChar(&itemid);
                      if (!rc) break;
                      if (0 == itemid)
                        break;

                      if (ON_LayerTypeCodes::ObsoleteSelectiveClippingData == itemid) //28
                      {
                        bool noClippingPlanes = false;
                        ON_UuidList selectiveList;
                        rc = file.ReadBool(&noClippingPlanes);
                        if (!rc) break;
                        rc = selectiveList.Read(file);
                        if (!rc) break;
                        //if (noClippingPlanes)
                        //  SetClipParticipationForNone();
                        //else if (selectiveList.Count() > 0)
                        //  SetClipParticipationList(selectiveList.Array(), selectiveList.Count(), true);
                        //else
                        //  SetClipParticipationForAll();

                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 10)
                        break;

                      if (ON_LayerTypeCodes::SectionHatchIndex == itemid) // 30
                      {
                        int pattern = 0;
                        rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, &pattern);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchIndex(pattern);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::SectionHatchScale == itemid) // 31
                      {
                        double scale = 1;
                        rc = file.ReadDouble(&scale);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchScale(scale);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::SectionHatchRotation == itemid) // 32
                      {
                        double rotation = 0;
                        rc = file.ReadDouble(&rotation);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchRotation(rotation);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 11)
                        break;

                      if (ON_LayerTypeCodes::SectionFillRule == itemid)
                      {
                        unsigned char c = 0;
                        rc = file.ReadChar(&c);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetSectionFillRule(ON::SectionFillRuleFromUnsigned(c));
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 12)
                        break;

                      if (ON_LayerTypeCodes::CustomLinetype == itemid)
                      {
                        ON_Linetype lt;
                        rc = lt.Read(file);
                        if (!rc) break;
                        // 17 Feb 2023 S. Baer
                        // Custom linetype per layer was a short lived experiment
                        // We still need to read a linetype out of the few 3dm files
                        // that have them, but we no longer set any sort of custom linetype
                        //SetCustomLinetype(lt);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 13)
                        break;

                      // visible in new detail (1.14)
                      if (ON_LayerTypeCodes::PerViewportIsVisibleInNewDetails == itemid)
                      {
                        bool b = true;
                        rc = file.ReadBool(&b);
                        if (!rc) break;
                        SetPerViewportIsVisibleInNewDetails(b);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 14)
                        break;

                      if (ON_LayerTypeCodes::CustomSectionStyle == itemid)
                      {
                        ON_SectionStyle section_style;
                        rc = section_style.Read(file);
                        if (!rc) break;
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::ObsoleteSelectiveClippingListType == itemid)
                      {
                        bool b = true;
                        file.ReadBool(&b);
                        if (!rc) break;
                        //if (nullptr == m_private)
                        //  m_private = new ON_LayerPrivate();
                        //m_private->m_clipplane_list_is_participation = b;

                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      // Add new item reading above and increment the LastLayerTypeCode value
                      // in the enum. Be sure to test reading of old and new files by old and new
                      // code, before checking in your changes.
                      if (itemid > ON_LayerTypeCodes::LastLayerTypeCode)
                      {
                        // we are reading file written with code newer than this code
                        itemid = 0;
                      }

                      break;
                    }

                    if (rc && 0 != itemid)
                    {
                      ON_ERROR("Bug in ON_Layer::Read or Write");
                    }

                  }
                }
              }
            }
          }
        }
      }
    }

    if ( IdIsNil()  )
    {
      // old files didn't have layer ids and we need unique ones.
      SetId();
    }
  }
  else
  {
    ON_ERROR("ON_Layer::Read() encountered a layer written by future code.");
    rc = false;
  }

  return rc;
}